

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall
FascodeUtil::msg::print(msg *this,MSG_TYPE msgtype,string *appname,int numberspace,string *message)

{
  int numberspace_00;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string *local_30;
  string *message_local;
  string *psStack_20;
  int numberspace_local;
  string *appname_local;
  msg *pmStack_10;
  MSG_TYPE msgtype_local;
  msg *this_local;
  
  local_30 = message;
  message_local._4_4_ = numberspace;
  psStack_20 = appname;
  appname_local._4_4_ = msgtype;
  pmStack_10 = this;
  std::__cxx11::string::string((string *)&local_50,(string *)appname);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70," ",&local_71);
  numberspace_00 = message_local._4_4_;
  std::__cxx11::string::string((string *)&local_a8,(string *)message);
  print(this,msgtype,&local_50,&local_70,numberspace_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void msg::print(MSG_TYPE msgtype,std::string appname,int numberspace,std::string message){
        print(msgtype,appname," ",numberspace,message);
    }